

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_8::DiskHandle::copy(DiskHandle *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  off_t offset;
  bool bVar1;
  bool bVar2;
  int iVar3;
  NullableValue<int> *other;
  int *piVar4;
  uint *puVar5;
  void *pvVar6;
  long *in_RCX;
  stat *__buf;
  stat *__buf_00;
  long in_R8;
  NullableValue<int> in_R9;
  char *local_2c8;
  NullableValue<int> local_2a8;
  unsigned_long local_248;
  uint64_t local_240;
  off_t amount_1;
  off_t zeroTo;
  Fault local_228;
  Fault f_3;
  Fault f_2;
  SyscallResult local_204;
  SyscallResult _kjSyscallResult;
  Fault f_1;
  undefined1 auStack_1f0 [4];
  int error_1;
  NullableValue<int> *local_1e8;
  off_t *local_1e0;
  int local_1d4;
  undefined1 auStack_1d0 [4];
  int _kjSyscallError_1;
  off_t nextData;
  ArrayDisposer *local_1c0;
  char *local_1b8;
  size_t n;
  size_t amount;
  off_t copyTo;
  Fault local_198;
  Fault f;
  undefined1 auStack_180 [4];
  int error;
  NullableValue<int> *local_178;
  off_t *local_170;
  int local_164;
  char *pcStack_160;
  int _kjSyscallError;
  off_t nextHole;
  char *local_150;
  off_t end;
  off_t fromPos;
  off_t toPos;
  undefined1 local_130 [8];
  void *local_128;
  void *local_100;
  void *local_f8 [2];
  void *pvStack_e8;
  file_clone_range range;
  DiskHandle local_b8;
  unsigned_long local_b0 [5];
  DiskHandle local_88;
  long local_80;
  Maybe<int> local_48;
  NullableValue<int> local_40;
  NullableValue<int> otherFd;
  uint64_t size_local;
  uint64_t fromOffset_local;
  ReadableFile *from_local;
  uint64_t offset_local;
  DiskHandle *this_local;
  
  otherFd = in_R9;
  (**(code **)*in_RCX)();
  other = _::readMaybe<int>(&local_48);
  _::NullableValue<int>::NullableValue(&local_40,other);
  Maybe<int>::~Maybe(&local_48);
  piVar4 = _::NullableValue::operator_cast_to_int_((NullableValue *)&local_40);
  if (piVar4 == (int *)0x0) {
    bVar2 = false;
    goto LAB_0040437d;
  }
  bVar2 = false;
  if ((src == (EVP_PKEY_CTX *)0x0) && (bVar2 = false, in_R8 == 0)) {
    bVar1 = kj::operator==(otherFd);
    bVar2 = false;
    if (bVar1) {
      stat(&local_88,(char *)dst,__buf);
      bVar2 = local_80 == 0;
    }
  }
  if (bVar2) {
    iVar3 = AutoCloseFd::operator_cast_to_int((AutoCloseFd *)dst);
    puVar5 = (uint *)_::NullableValue<int>::operator*(&local_40);
    iVar3 = ioctl(iVar3,0x40049409,(ulong)*puVar5);
    if (-1 < iVar3) {
      stat(&local_b8,(char *)dst,__buf_00);
      Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,local_b0);
      bVar2 = true;
      goto LAB_0040437d;
    }
  }
  else {
    if (otherFd == (NullableValue<int>)0x0) {
      toPos = 0;
      Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,(unsigned_long *)&toPos);
      bVar2 = true;
      goto LAB_0040437d;
    }
    range.src_offset = 0;
    range.src_length = 0;
    pvStack_e8 = (void *)0x0;
    range.src_fd = 0;
    piVar4 = _::NullableValue<int>::operator*(&local_40);
    pvStack_e8 = (void *)(long)*piVar4;
    range.src_length = (__u64)src;
    bVar2 = kj::operator==(otherFd);
    if (bVar2) {
      local_2a8.isSet = false;
      local_2a8._1_3_ = 0;
      local_2a8.field_1 = (anon_union_4_1_a8c68091_for_NullableValue<int>_2)0x0;
    }
    else {
      local_2a8 = otherFd;
    }
    range.src_offset._0_1_ = local_2a8.isSet;
    range.src_offset._1_3_ = local_2a8._1_3_;
    range.src_offset._4_4_ = local_2a8.field_1;
    iVar3 = AutoCloseFd::operator_cast_to_int((AutoCloseFd *)dst);
    iVar3 = ioctl(iVar3,0x4020940d,&pvStack_e8);
    if (-1 < iVar3) {
      (**(code **)(*in_RCX + 0x10))(local_130);
      local_100 = (void *)((long)local_128 - in_R8);
      local_f8[0] = (void *)min<unsigned_long,unsigned_long&>
                                      ((unsigned_long *)&local_100,(unsigned_long *)&otherFd);
      Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,(unsigned_long *)local_f8);
      bVar2 = true;
      goto LAB_0040437d;
    }
  }
  end = in_R8;
  fromPos = (off_t)src;
  bVar2 = kj::operator==(otherFd);
  if (bVar2) {
    local_2c8 = (char *)MaxValue_::operator_cast_to_long((MaxValue_ *)&maxValue);
  }
  else {
    local_2c8 = (char *)(in_R8 + (long)otherFd);
  }
  local_150 = local_2c8;
  do {
    _auStack_180 = (off_t *)&stack0xfffffffffffffea0;
    local_178 = &local_40;
    local_170 = &end;
    local_164 = _::Debug::
                syscallError<kj::(anonymous_namespace)::DiskHandle::copy(unsigned_long,kj::ReadableFile_const&,unsigned_long,unsigned_long)const::_lambda()_1_>
                          ((anon_class_24_3_d7b28de4 *)auStack_180,false);
    if (local_164 != 0) {
      if (local_164 == 6) {
        f.exception = (Exception *)(end - in_R8);
        Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,(unsigned_long *)&f);
        bVar2 = true;
        goto LAB_0040437d;
      }
      if (local_164 != 0x16) {
        _::Debug::Fault::Fault
                  (&local_198,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x240,local_164,"lseek(fd, pos, SEEK_HOLE)","");
        copyTo = end - in_R8;
        Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,(unsigned_long *)&copyTo);
        bVar2 = true;
        _::Debug::Fault::~Fault(&local_198);
        goto LAB_0040437d;
      }
      pcStack_160 = local_150;
    }
    amount = min<long&,long&>((long *)&local_150,(long *)&stack0xfffffffffffffea0);
    offset = fromPos;
    n = amount - end;
    if (n != 0) {
      piVar4 = _::NullableValue<int>::operator*(&local_40);
      local_1b8 = (char *)copyChunk((DiskHandle *)dst,offset,*piVar4,end,n);
      end = (off_t)(local_1b8 + end);
      fromPos = (off_t)(local_1b8 + fromPos);
      if (local_1b8 < n) {
        local_1c0 = (ArrayDisposer *)(end + -in_R8);
        Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,(unsigned_long *)&local_1c0);
        bVar2 = true;
        goto LAB_0040437d;
      }
    }
    if ((char *)end == local_150) {
      nextData = end - in_R8;
      Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,(unsigned_long *)&nextData);
      bVar2 = true;
      goto LAB_0040437d;
    }
    _auStack_1f0 = (off_t *)auStack_1d0;
    local_1e8 = &local_40;
    local_1e0 = &end;
    local_1d4 = _::Debug::
                syscallError<kj::(anonymous_namespace)::DiskHandle::copy(unsigned_long,kj::ReadableFile_const&,unsigned_long,unsigned_long)const::_lambda()_2_>
                          ((anon_class_24_3_d01d764e *)auStack_1f0,false);
    if (local_1d4 != 0) {
      if (local_1d4 != 6) {
        if (local_1d4 == 0x16) {
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                    ((Fault *)&stack0xfffffffffffffe00,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x262,FAILED,(char *)0x0,
                     "\"can\'t determine hole size; SEEK_DATA not supported\"",
                     (char (*) [51])"can\'t determine hole size; SEEK_DATA not supported");
          _::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffe00);
        }
        _::Debug::Fault::Fault
                  (&local_228,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x26c,local_1d4,"lseek(fd, pos, SEEK_HOLE)","");
        zeroTo = end - in_R8;
        Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,(unsigned_long *)&zeroTo);
        bVar2 = true;
        _::Debug::Fault::~Fault(&local_228);
        goto LAB_0040437d;
      }
      f_2.exception = (Exception *)auStack_1d0;
      local_204 = _::Debug::
                  syscall<kj::(anonymous_namespace)::DiskHandle::copy(unsigned_long,kj::ReadableFile_const&,unsigned_long,unsigned_long)const::_lambda()_3_>
                            ((anon_class_16_2_3dcda35c *)&f_2,false);
      pvVar6 = _::Debug::SyscallResult::operator_cast_to_void_(&local_204);
      if (pvVar6 == (void *)0x0) {
        iVar3 = _::Debug::SyscallResult::getErrorNumber(&local_204);
        _::Debug::Fault::Fault
                  (&f_3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x266,iVar3,"nextData = lseek(*otherFd, 0, SEEK_END)","");
        _::Debug::Fault::fatal(&f_3);
      }
      if ((long)local_150 < (long)_auStack_1d0) {
        local_150 = _auStack_1d0;
      }
    }
    amount_1 = min<long&,long&>((long *)&local_150,(long *)auStack_1d0);
    local_240 = amount_1 - end;
    if (0 < (long)local_240) {
      zero((DiskHandle *)dst,fromPos,local_240);
      fromPos = local_240 + fromPos;
      end = amount_1;
    }
  } while ((char *)end != local_150);
  local_248 = end - in_R8;
  Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,&local_248);
  bVar2 = true;
LAB_0040437d:
  _::NullableValue<int>::~NullableValue(&local_40);
  if (!bVar2) {
    Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,(void *)0x0);
  }
  return (int)this;
}

Assistant:

kj::Maybe<size_t> copy(uint64_t offset, const ReadableFile& from,
                         uint64_t fromOffset, uint64_t size) const {
    KJ_IF_MAYBE(otherFd, from.getFd()) {
#ifdef FICLONE
      if (offset == 0 && fromOffset == 0 && size == kj::maxValue && stat().size == 0) {
        if (ioctl(fd, FICLONE, *otherFd) >= 0) {
          return stat().size;
        }
      } else if (size > 0) {    // src_length = 0 has special meaning for the syscall, so avoid.
        struct file_clone_range range;
        memset(&range, 0, sizeof(range));
        range.src_fd = *otherFd;
        range.dest_offset = offset;
        range.src_offset = fromOffset;
        range.src_length = size == kj::maxValue ? 0 : size;
        if (ioctl(fd, FICLONERANGE, &range) >= 0) {
          // TODO(someday): What does FICLONERANGE actually do if the range goes past EOF? The docs
          //   don't say. Maybe it only copies the parts that exist. Maybe it punches holes for the
          //   rest. Where does the destination file's EOF marker end up? Who knows?
          return kj::min(from.stat().size - fromOffset, size);
        }
      } else {
        // size == 0
        return size_t(0);
      }

      // ioctl failed. Almost all failures documented for these are of the form "the operation is
      // not supported for the filesystem(s) specified", so fall back to other approaches.
#endif

      off_t toPos = offset;
      off_t fromPos = fromOffset;
      off_t end = size == kj::maxValue ? off_t(kj::maxValue) : off_t(fromOffset + size);

      for (;;) {
        // Handle data.
        {
          // Find out how much data there is before the next hole.
          off_t nextHole;
#ifdef SEEK_HOLE
          KJ_SYSCALL_HANDLE_ERRORS(nextHole = lseek(*otherFd, fromPos, SEEK_HOLE)) {
            case EINVAL:
              // SEEK_HOLE probably not supported. Assume no holes.
              nextHole = end;
              break;
            case ENXIO:
              // Past EOF. Stop here.
              return fromPos - fromOffset;
            default:
              KJ_FAIL_SYSCALL("lseek(fd, pos, SEEK_HOLE)", error) { return fromPos - fromOffset; }
          }
#else
          // SEEK_HOLE not supported. Assume no holes.
          nextHole = end;
#endif

          // Copy the next chunk of data.
          off_t copyTo = kj::min(end, nextHole);
          size_t amount = copyTo - fromPos;
          if (amount > 0) {
            size_t n = copyChunk(toPos, *otherFd, fromPos, amount);
            fromPos += n;
            toPos += n;

            if (n < amount) {
              return fromPos - fromOffset;
            }
          }

          if (fromPos == end) {
            return fromPos - fromOffset;
          }
        }

#ifdef SEEK_HOLE
        // Handle hole.
        {
          // Find out how much hole there is before the next data.
          off_t nextData;
          KJ_SYSCALL_HANDLE_ERRORS(nextData = lseek(*otherFd, fromPos, SEEK_DATA)) {
            case EINVAL:
              // SEEK_DATA probably not supported. But we should only have gotten here if we
              // were expecting a hole.
              KJ_FAIL_ASSERT("can't determine hole size; SEEK_DATA not supported");
              break;
            case ENXIO:
              // No more data. Set to EOF.
              KJ_SYSCALL(nextData = lseek(*otherFd, 0, SEEK_END));
              if (nextData > end) {
                end = nextData;
              }
              break;
            default:
              KJ_FAIL_SYSCALL("lseek(fd, pos, SEEK_HOLE)", error) { return fromPos - fromOffset; }
          }

          // Write zeros.
          off_t zeroTo = kj::min(end, nextData);
          off_t amount = zeroTo - fromPos;
          if (amount > 0) {
            zero(toPos, amount);
            toPos += amount;
            fromPos = zeroTo;
          }

          if (fromPos == end) {
            return fromPos - fromOffset;
          }
        }
#endif
      }
    }

    // Indicates caller should call File::copy() default implementation.
    return nullptr;
  }